

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O2

void __thiscall iDynTree::ModelLoader::ModelLoader(ModelLoader *this)

{
  _Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false> this_00;
  
  this_00._M_head_impl = (ModelLoaderPimpl *)operator_new(0x160);
  memset(this_00._M_head_impl,0,0x160);
  ModelLoaderPimpl::ModelLoaderPimpl(this_00._M_head_impl);
  (this->m_pimpl)._M_t.
  super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
  .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>._M_head_impl =
       this_00._M_head_impl;
  (this_00._M_head_impl)->m_isModelValid = false;
  return;
}

Assistant:

ModelLoader::ModelLoader()
    : m_pimpl(new ModelLoaderPimpl())
    {
        m_pimpl->m_isModelValid = false;
    }